

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpcollisionlist.cpp
# Opt level: O2

bool __thiscall jrtplib::RTPCollisionList::HasAddress(RTPCollisionList *this,RTPAddress *addr)

{
  char cVar1;
  list<jrtplib::RTPCollisionList::AddressAndTime,_std::allocator<jrtplib::RTPCollisionList::AddressAndTime>_>
  *plVar2;
  _List_node_base *p_Var3;
  
  plVar2 = &this->addresslist;
  p_Var3 = (_List_node_base *)plVar2;
  do {
    p_Var3 = (((_List_base<jrtplib::RTPCollisionList::AddressAndTime,_std::allocator<jrtplib::RTPCollisionList::AddressAndTime>_>
                *)&p_Var3->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var3 == (_List_node_base *)plVar2) break;
    cVar1 = (**(code **)(*(long *)p_Var3[1]._M_next + 8))(p_Var3[1]._M_next,addr);
  } while (cVar1 == '\0');
  return p_Var3 != (_List_node_base *)plVar2;
}

Assistant:

bool RTPCollisionList::HasAddress(const RTPAddress *addr) const
{
	std::list<AddressAndTime>::const_iterator it;
	
	for (it = addresslist.begin() ; it != addresslist.end() ; it++)
	{
		if (((*it).addr)->IsSameAddress(addr))
			return true;
	}

	return false;	
}